

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O1

void __thiscall
rsg::VariableWrite::VariableWrite
          (VariableWrite *this,GeneratorState *state,ConstValueRangeAccess valueRange)

{
  VariableManager *pVVar1;
  pointer ppVVar2;
  pointer ppVVar3;
  deRandom *rnd;
  ConstValueRangeAccess value;
  ConstValueRangeAccess value_00;
  ValueRangeAccess valueRange_00;
  size_type sVar4;
  bool bVar5;
  deUint32 dVar6;
  Variable *variable;
  ValueEntry *pVVar7;
  pointer pSVar8;
  Scalar *pSVar9;
  ValueEntry *val;
  Scalar *pSVar10;
  Variable **ppVVar11;
  pointer ppVVar12;
  int ndx;
  int iVar13;
  float fVar14;
  ValueRange infRange;
  VariableType *pVVar15;
  _Alloc_hider _Var16;
  ValueRange local_b8;
  
  (this->super_VariableAccess).m_variable = (Variable *)0x0;
  (this->super_VariableAccess).m_valueAccess.super_ConstStridedValueAccess<64>.m_type =
       (VariableType *)0x0;
  (this->super_VariableAccess).m_valueAccess.super_ConstStridedValueAccess<64>.m_value =
       (Scalar *)0x0;
  (this->super_VariableAccess).super_Expression._vptr_Expression =
       (_func_int **)&PTR__Expression_00d59c00;
  pVVar1 = state->m_varManager;
  local_b8.m_type.m_typeName._M_string_length = (size_type)valueRange.m_max;
  local_b8.m_type._0_8_ = valueRange.m_type;
  local_b8.m_type.m_typeName._M_dataplus._M_p = (pointer)valueRange.m_min;
  ppVVar12 = (pVVar1->m_entryCache).
             super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppVVar12 !=
      (pVVar1->m_entryCache).
      super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      bVar5 = anon_unknown_0::IsWritableSupersetEntry::operator()
                        ((IsWritableSupersetEntry *)&local_b8,*ppVVar12);
      if (bVar5) break;
      ppVVar12 = ppVVar12 + 1;
    } while (ppVVar12 !=
             (pVVar1->m_entryCache).
             super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  sVar4 = local_b8.m_type.m_typeName._M_string_length;
  ppVVar11 = &(this->super_VariableAccess).m_variable;
  ppVVar2 = (pVVar1->m_entryCache).
            super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppVVar3 = (state->m_varManager->m_entryCache).
            super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  pVVar15 = (VariableType *)local_b8.m_type._0_8_;
  _Var16._M_p = local_b8.m_type.m_typeName._M_dataplus._M_p;
  bVar5 = anon_unknown_0::canAllocateVariable(state,valueRange.m_type);
  if ((!bVar5) ||
     ((ppVVar12 != ppVVar3 && (fVar14 = deRandom_getFloat(&state->m_random->m_rnd), 0.1 <= fVar14)))
     ) {
    rnd = &state->m_random->m_rnd;
    pVVar7 = (ValueEntry *)0x0;
    iVar13 = 0;
    do {
      if ((iVar13 < 1) ||
         (dVar6 = deRandom_getUint32(rnd), local_b8.m_type._0_8_ = pVVar15,
         local_b8.m_type.m_typeName._M_dataplus._M_p = _Var16._M_p,
         local_b8.m_type.m_typeName._M_string_length = sVar4, (int)(dVar6 % (iVar13 + 1U)) < 1)) {
        pVVar7 = *ppVVar12;
        local_b8.m_type._0_8_ = pVVar15;
        local_b8.m_type.m_typeName._M_dataplus._M_p = _Var16._M_p;
        local_b8.m_type.m_typeName._M_string_length = sVar4;
      }
      do {
        ppVVar12 = ppVVar12 + 1;
        if (ppVVar12 == ppVVar2) break;
        bVar5 = anon_unknown_0::IsWritableSupersetEntry::operator()
                          ((IsWritableSupersetEntry *)&local_b8,*ppVVar12);
      } while (!bVar5);
      iVar13 = iVar13 + 1;
    } while (ppVVar12 != ppVVar3);
    variable = pVVar7->m_variable;
  }
  else {
    variable = VariableManager::allocate(state->m_varManager,valueRange.m_type);
  }
  *ppVVar11 = variable;
  pVVar7 = VariableManager::getParentValue(state->m_varManager,variable);
  if (pVVar7 == (ValueEntry *)0x0) {
    ValueRange::ValueRange(&local_b8,&(*ppVVar11)->m_type);
    pSVar8 = local_b8.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_b8.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_b8.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pSVar8 = (Scalar *)0x0;
    }
    valueRange_00.super_ConstValueRangeAccess.m_min = (Scalar *)pVVar15;
    valueRange_00.super_ConstValueRangeAccess.m_type = (VariableType *)pSVar8;
    valueRange_00.super_ConstValueRangeAccess.m_max = (Scalar *)_Var16._M_p;
    anon_unknown_0::setInfiniteRange(valueRange_00);
    if (local_b8.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_b8.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_b8.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
      super__Vector_impl_data._M_start = (Scalar *)0x0;
    }
    if (local_b8.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_b8.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_b8.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
      super__Vector_impl_data._M_start = (Scalar *)0x0;
    }
    value_00.m_min =
         local_b8.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
         super__Vector_impl_data._M_start;
    value_00.m_type = &local_b8.m_type;
    value_00.m_max =
         local_b8.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
         super__Vector_impl_data._M_start;
    VariableManager::setValue(state->m_varManager,*ppVVar11,value_00);
    ValueRange::~ValueRange(&local_b8);
  }
  else {
    pSVar9 = (pVVar7->m_valueRange).m_min.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar10 = (pVVar7->m_valueRange).m_max.
              super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (pSVar9 == (pVVar7->m_valueRange).m_min.
                  super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      pSVar9 = (Scalar *)0x0;
    }
    if (pSVar10 ==
        (pVVar7->m_valueRange).m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pSVar10 = (Scalar *)0x0;
    }
    value.m_min = pSVar9;
    value.m_type = &(pVVar7->m_valueRange).m_type;
    value.m_max = pSVar10;
    VariableManager::setValue(state->m_varManager,*ppVVar11,value);
  }
  return;
}

Assistant:

VariableWrite::VariableWrite (GeneratorState& state, ConstValueRangeAccess valueRange)
{
	DE_ASSERT(!valueRange.getType().isVoid());

	// Find variable with range that is superset of given range
	IsWritableSupersetEntry::Iterator	first	= state.getVariableManager().getBegin(IsWritableSupersetEntry(valueRange));
	IsWritableSupersetEntry::Iterator	end		= state.getVariableManager().getEnd(IsWritableSupersetEntry(valueRange));

	const float	createOnAssignWeight	= 0.1f; // Will essentially create an unused variable
	bool		createVar				= canAllocateVariable(state, valueRange.getType()) && (first == end || getWeightedBool(state.getRandom(), createOnAssignWeight));

	if (createVar)
	{
		m_variable = state.getVariableManager().allocate(valueRange.getType());
		// \note Storage will be LOCAL
	}
	else
	{
		// Choose random
		DE_ASSERT(first != end);
		const ValueEntry* entry = state.getRandom().choose<const ValueEntry*>(first, end);
		m_variable = entry->getVariable();
	}

	DE_ASSERT(m_variable);

	// Reset value range.
	const ValueEntry* parentEntry = state.getVariableManager().getParentValue(m_variable);
	if (parentEntry)
	{
		// Use parent value range.
		state.getVariableManager().setValue(m_variable, parentEntry->getValueRange());
	}
	else
	{
		// Use infinite range.
		ValueRange infRange(m_variable->getType());
		setInfiniteRange(infRange);

		state.getVariableManager().setValue(m_variable, infRange.asAccess());
	}
}